

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHash.hpp
# Opt level: O0

uint32 Hash::SuperFastHash(char *data,int len,uint32 hash)

{
  uint uVar1;
  uint uVar2;
  int rem;
  uint32 tmp;
  uint32 hash_local;
  int len_local;
  char *data_local;
  
  if ((len < 1) || (data == (char *)0x0)) {
    data_local._4_4_ = 0;
  }
  else {
    uVar1 = len & 3;
    rem = hash;
    _hash_local = (byte *)data;
    for (tmp = len >> 2; 0 < (int)tmp; tmp = tmp - 1) {
      uVar2 = (uint)_hash_local[1] * 0x100 + (uint)*_hash_local + rem;
      uVar2 = uVar2 * 0x10000 ^
              ((uint)_hash_local[3] * 0x100 + (uint)_hash_local[2]) * 0x800 ^ uVar2;
      _hash_local = _hash_local + 4;
      rem = (uVar2 >> 0xb) + uVar2;
    }
    if (uVar1 == 1) {
      uVar1 = ((char)*_hash_local + rem) * 0x400 ^ (char)*_hash_local + rem;
      rem = (uVar1 >> 1) + uVar1;
    }
    else if (uVar1 == 2) {
      uVar1 = (uint)_hash_local[1] * 0x100 + (uint)*_hash_local + rem;
      uVar1 = uVar1 * 0x800 ^ uVar1;
      rem = (uVar1 >> 0x11) + uVar1;
    }
    else if (uVar1 == 3) {
      uVar1 = (uint)_hash_local[1] * 0x100 + (uint)*_hash_local + rem;
      uVar1 = (int)(char)_hash_local[2] << 0x12 ^ uVar1 * 0x10000 ^ uVar1;
      rem = (uVar1 >> 0xb) + uVar1;
    }
    uVar1 = rem << 3 ^ rem;
    uVar1 = (uVar1 >> 5) + uVar1;
    uVar1 = uVar1 * 0x10 ^ uVar1;
    uVar1 = (uVar1 >> 0x11) + uVar1;
    uVar1 = uVar1 * 0x2000000 ^ uVar1;
    data_local._4_4_ = (uVar1 >> 6) + uVar1;
  }
  return data_local._4_4_;
}

Assistant:

static uint32 SuperFastHash (const char * data, int len, uint32 hash)
    {
        uint32  tmp;
        int     rem;

        if (len <= 0 || data == NULL) return 0;

        rem = len & 3;
        len >>= 2;

        /* Main loop */
        for (;len > 0; len--)
        {
            hash  += get16bits (data);
            tmp    = (get16bits (data+2) << 11) ^ hash;
            hash   = (hash << 16) ^ tmp;
            data  += 2*sizeof (uint16);
            hash  += hash >> 11;
        }

        /* Handle end cases */
        switch (rem)
        {
            case 3: hash += get16bits (data);
                    hash ^= hash << 16;
                    hash ^= data[sizeof (uint16)] << 18;
                    hash += hash >> 11;
                    break;
            case 2: hash += get16bits (data);
                    hash ^= hash << 11;
                    hash += hash >> 17;
                    break;
            case 1: hash += *data;
                    hash ^= hash << 10;
                    hash += hash >> 1;
        }

        /* Force "avalanching" of final 127 bits */
        hash ^= hash << 3;
        hash += hash >> 5;
        hash ^= hash << 4;
        hash += hash >> 17;
        hash ^= hash << 25;
        hash += hash >> 6;

        return hash;
    }